

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib670.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  time_t tVar3;
  int *piVar4;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  time_t delta;
  undefined1 local_200 [4];
  int maxfd;
  fd_set fdexcept;
  fd_set fdwrite;
  fd_set fdread;
  undefined1 auStack_78 [4];
  int rc;
  timeval timeout;
  int res;
  CURLcode result;
  ReadThis pooh;
  int still_running;
  int msgs_left;
  CURLMsg *msg;
  CURLMcode mres;
  CURLM *multi;
  curl_mimepart *part;
  curl_mime *mime;
  char *URL_local;
  
  part = (curl_mimepart *)0x0;
  pooh.count = 0;
  timeout.tv_usec._0_4_ = 0x77;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    pooh.easy = (CURL *)0x0;
    pooh.origin._0_4_ = 0;
    _res = curl_easy_init();
    timeout.tv_usec._0_4_ = curl_easy_setopt(_res,0x2712,URL);
    if ((((int)timeout.tv_usec == 0) &&
        (timeout.tv_usec._0_4_ = curl_easy_setopt(_res,0x29,1), (int)timeout.tv_usec == 0)) &&
       (timeout.tv_usec._0_4_ = curl_easy_setopt(_res,0x2a,1), (int)timeout.tv_usec == 0)) {
      part = (curl_mimepart *)curl_mime_init(_res);
      uVar2 = curl_mime_addpart(part);
      timeout.tv_usec._4_4_ = curl_mime_name(uVar2,"field");
      if (timeout.tv_usec._4_4_ == 0) {
        timeout.tv_usec._0_4_ = curl_mime_data_cb(uVar2,2,read_callback,0,0,&res);
      }
      if (timeout.tv_usec._4_4_ == 0) {
        if (((int)timeout.tv_usec != 0) ||
           (timeout.tv_usec._0_4_ = curl_easy_setopt(_res,0x281d,part), (int)timeout.tv_usec == 0))
        {
          uVar2 = curl_multi_init();
          msg._4_4_ = curl_multi_add_handle(uVar2,_res);
          do {
            if (msg._4_4_ != 0) goto LAB_00101699;
            delta._4_4_ = -1;
            msg._4_4_ = curl_multi_perform(uVar2,&pooh.count);
            if ((pooh.count == 0) || (msg._4_4_ != 0)) goto LAB_00101699;
            if (pooh.easy != (CURL *)0x0) {
              tVar3 = time((time_t *)0x0);
              if (7 < tVar3 - (long)pooh.easy) {
                curl_mfprintf(_stderr,"unpausing failed: drain problem?\n");
                timeout.tv_usec._0_4_ = 0x1c;
                goto LAB_00101699;
              }
              if (1 < tVar3 - (long)pooh.easy) {
                curl_easy_pause(_res,0);
              }
            }
            for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
              fdwrite.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
            }
            for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
              fdexcept.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
            }
            for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
              *(undefined8 *)(local_200 + (ulong)__arr_2._4_4_ * 8) = 0;
            }
            _auStack_78 = 0;
            timeout.tv_sec = 200000;
            msg._4_4_ = curl_multi_fdset(uVar2,fdwrite.__fds_bits + 0xf,fdexcept.__fds_bits + 0xf,
                                         local_200,(long)&delta + 4);
            if (msg._4_4_ != 0) goto LAB_00101699;
            iVar1 = select(delta._4_4_ + 1,(fd_set *)(fdwrite.__fds_bits + 0xf),
                           (fd_set *)(fdexcept.__fds_bits + 0xf),(fd_set *)local_200,
                           (timeval *)auStack_78);
          } while (iVar1 != -1);
          curl_mfprintf(_stderr,"Select error\n");
LAB_00101699:
          if (msg._4_4_ != 0) {
            while (piVar4 = (int *)curl_multi_info_read(uVar2,&pooh.field_0x14),
                  piVar4 != (int *)0x0) {
              if (*piVar4 == 1) {
                timeout.tv_usec._0_4_ = piVar4[4];
                timeout.tv_usec._4_4_ = (int)timeout.tv_usec;
              }
            }
          }
          curl_multi_remove_handle(uVar2,_res);
          curl_multi_cleanup(uVar2);
        }
      }
      else {
        curl_mfprintf(_stderr,"Something went wrong when building the mime structure: %d\n",
                      timeout.tv_usec._4_4_);
      }
    }
    curl_easy_cleanup(_res);
    curl_mime_free(part);
    curl_global_cleanup();
    URL_local._4_4_ = (int)timeout.tv_usec;
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
#if defined(LIB670) || defined(LIB671)
  curl_mime *mime = NULL;
  curl_mimepart *part;
#else
  CURLFORMcode formrc;
  struct curl_httppost *formpost = NULL;
  struct curl_httppost *lastptr = NULL;
#endif
#if defined(LIB670) || defined(LIB672)
  CURLM *multi = NULL;
  CURLMcode mres;
  CURLMsg *msg;
  int msgs_left;
  int still_running = 0;
#endif

  struct ReadThis pooh;
  CURLcode result;
  int res = TEST_ERR_FAILURE;

  /*
   * Check proper pausing/unpausing from a mime or form read callback.
   */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  pooh.origin = (time_t) 0;
  pooh.count = 0;
  pooh.easy = curl_easy_init();

  /* First set the URL that is about to receive our POST. */
  test_setopt(pooh.easy, CURLOPT_URL, URL);

  /* get verbose debug output please */
  test_setopt(pooh.easy, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(pooh.easy, CURLOPT_HEADER, 1L);

#if defined(LIB670) || defined(LIB671)
  /* Build the mime tree. */
  mime = curl_mime_init(pooh.easy);
  part = curl_mime_addpart(mime);
  result = curl_mime_name(part, name);
  if(!result)
    res = curl_mime_data_cb(part, (curl_off_t) 2, read_callback,
                            NULL, NULL, &pooh);

  if(result) {
    fprintf(stderr,
            "Something went wrong when building the mime structure: %d\n",
            (int) result);
    goto test_cleanup;
  }

  /* Bind mime data to its easy handle. */
  if(!res)
    test_setopt(pooh.easy, CURLOPT_MIMEPOST, mime);
#else
  /* Build the form. */
  formrc = curl_formadd(&formpost, &lastptr,
                        CURLFORM_COPYNAME, name,
                        CURLFORM_STREAM, &pooh,
                        CURLFORM_CONTENTLEN, (curl_off_t) 2,
                        CURLFORM_END);
  if(formrc) {
    fprintf(stderr, "curl_formadd() = %d\n", (int) formrc);
    goto test_cleanup;
  }

  /* We want to use our own read function. */
  test_setopt(pooh.easy, CURLOPT_READFUNCTION, read_callback);

  /* Send a multi-part formpost. */
  test_setopt(pooh.easy, CURLOPT_HTTPPOST, formpost);
#endif

#if defined(LIB670) || defined(LIB672)
  /* Use the multi interface. */
  multi = curl_multi_init();
  mres = curl_multi_add_handle(multi, pooh.easy);
  while(!mres) {
    struct timeval timeout;
    int rc = 0;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcept;
    int maxfd = -1;

    mres = curl_multi_perform(multi, &still_running);
    if(!still_running || mres != CURLM_OK)
      break;

    if(pooh.origin) {
      time_t delta = time(NULL) - pooh.origin;

      if(delta >= 4 * PAUSE_TIME) {
        fprintf(stderr, "unpausing failed: drain problem?\n");
        res = CURLE_OPERATION_TIMEDOUT;
        break;
      }

      if(delta >= PAUSE_TIME)
        curl_easy_pause(pooh.easy, CURLPAUSE_CONT);
    }

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcept);
    timeout.tv_sec = 0;
    timeout.tv_usec = 1000000 * PAUSE_TIME / 10;
    mres = curl_multi_fdset(multi, &fdread, &fdwrite, &fdexcept, &maxfd);
    if(mres)
      break;
#ifdef _WIN32
    if(maxfd == -1)
      Sleep(100);
    else
#endif
    rc = select(maxfd + 1, &fdread, &fdwrite, &fdexcept, &timeout);
    if(rc == -1) {
      fprintf(stderr, "Select error\n");
      break;
    }
  }

  if(mres != CURLM_OK)
    for(;;) {
      msg = curl_multi_info_read(multi, &msgs_left);
      if(!msg)
        break;
      if(msg->msg == CURLMSG_DONE) {
        result = msg->data.result;
        res = (int) result;
      }
    }

  curl_multi_remove_handle(multi, pooh.easy);
  curl_multi_cleanup(multi);

#else
  /* Use the easy interface. */
  test_setopt(pooh.easy, CURLOPT_XFERINFODATA, &pooh);
  test_setopt(pooh.easy, CURLOPT_XFERINFOFUNCTION, xferinfo);
  test_setopt(pooh.easy, CURLOPT_NOPROGRESS, 0L);
  result = curl_easy_perform(pooh.easy);
  res = (int) result;
#endif


test_cleanup:
  curl_easy_cleanup(pooh.easy);
#if defined(LIB670) || defined(LIB671)
  curl_mime_free(mime);
#else
  curl_formfree(formpost);
#endif

  curl_global_cleanup();
  return res;
}